

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

int hd_fake_throw(hd_context *ctx,int code,char *fmt,...)

{
  hd_error_context *phVar1;
  hd_error_stack_slot *phVar2;
  va_list args;
  
  ctx->error->errcode = 2;
  snprintf(ctx->error->message,0x100,"exception stack overflow!");
  ctx->error->message[0xff] = '\0';
  hd_flush_warnings(ctx);
  fprintf(_stderr,"error: %s\n",ctx->error->message);
  phVar1 = ctx->error;
  phVar2 = phVar1->top;
  phVar1->top = phVar2 + 1;
  phVar2[1].code = 2;
  return (int)phVar1;
}

Assistant:

static int hd_fake_throw(hd_context *ctx, int code, const char *fmt, ...)
{
    va_list args;
    ctx->error->errcode = code;
    va_start(args, fmt);
    snprintf(ctx->error->message, sizeof ctx->error->message, fmt, args);
    ctx->error->message[sizeof(ctx->error->message) - 1] = 0;
    va_end(args);

    if (code != HD_ERROR_ABORT)
    {
        hd_flush_warnings(ctx);
        fprintf(stderr, "error: %s\n", ctx->error->message);
#ifdef USE_OUTPUT_DEBUG_STRING
        OutputDebugStringA("error: ");
		OutputDebugStringA(ctx->error->message);
		OutputDebugStringA("\n");
#endif
    }

    /* We need to arrive in the always/catch block as if throw
     * had taken place. */
    ctx->error->top++;
    ctx->error->top->code = 2;
    return 0;
}